

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqc.c
# Opt level: O1

void opj_mqc_erterm_enc(opj_mqc_t *mqc)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  
  iVar2 = 0xc - mqc->ct;
  if (0 < iVar2) {
    do {
      mqc->c = mqc->c << ((byte)mqc->ct & 0x1f);
      mqc->ct = 0;
      opj_mqc_byteout(mqc);
      iVar3 = iVar2 - mqc->ct;
      bVar1 = (int)mqc->ct <= iVar2;
      iVar2 = iVar3;
    } while (iVar3 != 0 && bVar1);
  }
  if (*mqc->bp != 0xff) {
    opj_mqc_byteout(mqc);
    return;
  }
  return;
}

Assistant:

void opj_mqc_erterm_enc(opj_mqc_t *mqc)
{
    OPJ_INT32 k = (OPJ_INT32)(11 - mqc->ct + 1);

    while (k > 0) {
        mqc->c <<= mqc->ct;
        mqc->ct = 0;
        opj_mqc_byteout(mqc);
        k -= (OPJ_INT32)mqc->ct;
    }

    if (*mqc->bp != 0xff) {
        opj_mqc_byteout(mqc);
    }
}